

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::purgeMemoryOfIgnoredActors
          (HierarchicalTaskNetworkComponent *this)

{
  Actor *pAVar1;
  bool bVar2;
  vector<AI::Actor_*,_std::allocator<AI::Actor_*>_> *this_00;
  reference ppAVar3;
  Memory *this_01;
  reference pSVar4;
  iterator iVar5;
  iterator iVar6;
  reference __a;
  reference __b;
  vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_> *this_02;
  reference this_03;
  reference pEVar7;
  reference piVar8;
  reference __a_00;
  reference __b_00;
  iterator iStack_128;
  int id_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<int,_std::allocator<int>_> *__range2_3;
  Engram *engram;
  iterator __end3;
  iterator __begin3;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range3;
  FocusLocus *locus;
  iterator __end2_2;
  iterator __begin2_2;
  vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_> *__range2_2;
  int locusId;
  int id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  Stimulus *stimulus;
  iterator __end2;
  iterator __begin2;
  vector<AI::Stimulus,_std::allocator<AI::Stimulus>_> *__range2;
  vector<int,_std::allocator<int>_> ids;
  int stimulusId;
  Actor *ignoredActor;
  iterator __end1;
  iterator __begin1;
  vector<AI::Actor_*,_std::allocator<AI::Actor_*>_> *__range1;
  HierarchicalTaskNetworkComponent *this_local;
  
  this_00 = &(this->state).actorsToIgnore;
  __end1 = std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>::begin(this_00);
  ignoredActor = (Actor *)std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_>
                                *)&ignoredActor);
    if (!bVar2) {
      return;
    }
    ppAVar3 = __gnu_cxx::
              __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_>
              ::operator*(&__end1);
    pAVar1 = *ppAVar3;
    ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    this_01 = &(this->state).memory;
    __end2 = std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::begin
                       (&this_01->sensoryMemory);
    stimulus = (Stimulus *)
               std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::end
                         (&this_01->sensoryMemory);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<AI::Stimulus_*,_std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>_>
                                       *)&stimulus), bVar2) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<AI::Stimulus_*,_std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>_>
               ::operator*(&__end2);
      if ((pSVar4->type == Visual) && ((pSVar4->field_3).visual.target == pAVar1)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&__range2,
                   (value_type_conflict2 *)
                   ((long)&ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 4));
      }
      ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<AI::Stimulus_*,_std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>_>::
      operator++(&__end2);
    }
    iVar5 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&__range2);
    iVar6 = std::end<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              (iVar5._M_current,iVar6._M_current);
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
    _locusId = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &locusId), bVar2) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      __range2_2._4_4_ = *piVar8;
      __a = std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::operator[]
                      (&(this->state).memory.sensoryMemory,(long)__range2_2._4_4_);
      __b = std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::back
                      (&(this->state).memory.sensoryMemory);
      std::swap<AI::Stimulus>(__a,__b);
      std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::pop_back
                (&(this->state).memory.sensoryMemory);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    __range2_2._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&__range2);
    this_02 = &(this->state).memory.focusLocus;
    __end2_2 = std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::begin(this_02);
    locus = (FocusLocus *)std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::end(this_02)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<AI::FocusLocus_*,_std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>_>
                               *)&locus), bVar2) {
      this_03 = __gnu_cxx::
                __normal_iterator<AI::FocusLocus_*,_std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>_>
                ::operator*(&__end2_2);
      __end3 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(&this_03->engrams);
      engram = (Engram *)
               std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(&this_03->engrams);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                                         *)&engram), bVar2) {
        pEVar7 = __gnu_cxx::
                 __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                 ::operator*(&__end3);
        if ((pEVar7->type == Saw) && ((pEVar7->stimulus).field_3.visual.target == pAVar1)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&__range2,
                     (value_type_conflict2 *)&__range2_2);
          break;
        }
        __gnu_cxx::
        __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
        operator++(&__end3);
      }
      __range2_2._0_4_ = (int)__range2_2 + 1;
      __gnu_cxx::
      __normal_iterator<AI::FocusLocus_*,_std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>_>
      ::operator++(&__end2_2);
    }
    iVar5 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&__range2);
    iVar6 = std::end<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              (iVar5._M_current,iVar6._M_current);
    __end2_3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
    iStack_128 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffed8), bVar2) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_3);
      __a_00 = std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::operator[]
                         (&(this->state).memory.focusLocus,(long)*piVar8);
      __b_00 = std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::back
                         (&(this->state).memory.focusLocus);
      std::swap<AI::FocusLocus>(__a_00,__b_00);
      std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::pop_back
                (&(this->state).memory.focusLocus);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_3);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<AI::Actor_**,_std::vector<AI::Actor_*,_std::allocator<AI::Actor_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void HierarchicalTaskNetworkComponent::purgeMemoryOfIgnoredActors()
{
	for (auto ignoredActor : state.actorsToIgnore)
	{
		int stimulusId = 0;
		std::vector<int> ids;
		for (auto& stimulus : state.memory.sensoryMemory)
		{
			if (stimulus.type == StimulusType::Visual)
			{
				if (stimulus.visual.target == ignoredActor)
				{
					ids.push_back(stimulusId);
				}
			}

			stimulusId++;
		}

		std::sort(begin(ids), end(ids), std::greater<int>());

		for(auto id : ids)
		{
			std::swap(state.memory.sensoryMemory[id], state.memory.sensoryMemory.back());
			state.memory.sensoryMemory.pop_back();
		}

		int locusId = 0;
		ids.clear();
		for(auto& locus : state.memory.focusLocus)
		{
			for (auto& engram : locus.engrams)
			{
				if (engram.type == EngramType::Saw)
				{
					if (engram.stimulus.visual.target == ignoredActor)
					{
						ids.push_back(locusId);
						break;
					}
				}
			}

			locusId++;
		}

		std::sort(begin(ids), end(ids), std::greater<int>());

		for(auto id : ids)
		{
			std::swap(state.memory.focusLocus[id], state.memory.focusLocus.back());
			state.memory.focusLocus.pop_back();
		}
	}	
}